

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O3

void __thiscall re2c::Cases::emit(Cases *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  uint uVar1;
  OutputFile *pOVar2;
  bool *readCh_00;
  ulong uVar3;
  long lVar4;
  string local_50;
  
  pOVar2 = OutputFile::wind(o,ind);
  pOVar2 = OutputFile::ws(pOVar2,"switch (");
  output_yych_abi_cxx11_(&local_50,(re2c *)readCh,readCh_00);
  pOVar2 = OutputFile::wstring(pOVar2,&local_50);
  OutputFile::ws(pOVar2,") {\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar1 = this->cases_size;
  if (uVar1 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (*(State **)((long)&this->cases->to + lVar4) != this->def) {
        Case::emit((Case *)((long)&(this->cases->ranges).
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar4),o,ind);
        output_goto(o,1,readCh,(label_t)**(uint32_t **)((long)&this->cases->to + lVar4));
        uVar1 = this->cases_size;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < uVar1);
  }
  pOVar2 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar2,"default:");
  output_goto(o,1,readCh,(label_t)(this->def->label).value);
  pOVar2 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar2,"}\n");
  return;
}

Assistant:

void Cases::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	o.wind(ind).ws("switch (").wstring(output_yych (readCh)).ws(") {\n");
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to != def)
		{
			cases[i].emit (o, ind);
			output_goto (o, 1, readCh, cases[i].to->label);
		}
	}
	o.wind(ind).ws("default:");
	output_goto (o, 1, readCh, def->label);
	o.wind(ind).ws("}\n");
}